

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3raster.cpp
# Opt level: O2

bool32 rw::gl3::rasterFromImage(Raster *raster,Image *image)

{
  uint8 *puVar1;
  FILE *__stream;
  uint uVar2;
  bool32 bVar3;
  char *pcVar4;
  int iVar5;
  int32 depth;
  uint uVar6;
  int iVar7;
  long lVar8;
  uint8 *puVar9;
  uint8 *puVar10;
  code *pcVar11;
  Image *local_58;
  Error _e;
  
  if ((raster->type & 0xfU) != 4) {
    return 0;
  }
  depth = image->depth;
  if (depth < 9) {
    local_58 = Image::create(image->width,image->height,depth);
    local_58->stride = image->stride;
    puVar1 = image->palette;
    local_58->pixels = image->pixels;
    local_58->palette = puVar1;
    Image::unpalettize(local_58,false);
    depth = local_58->depth;
    image = local_58;
  }
  else {
    local_58 = (Image *)0x0;
  }
  lVar8 = (long)nativeRasterOffset;
  uVar2 = raster->format & 0xf00;
  uVar6 = depth << 0x1e | depth - 4U >> 2;
  if (uVar6 == 3) {
    if (gl3Caps == 0) {
      if (uVar2 != 0x100) goto LAB_001150d4;
      pcVar11 = conv_RGBA5551_from_ARGB1555;
    }
    else {
      pcVar11 = conv_RGBA8888_from_ARGB1555;
    }
  }
  else {
    if (uVar6 == 5) {
      pcVar11 = conv_RGBA8888_from_RGB888;
    }
    else {
      if (uVar6 != 7) goto LAB_001150d4;
      pcVar11 = conv_RGBA8888_from_RGBA8888;
    }
    if ((gl3Caps == 0) && (uVar2 != 0x500)) {
      if (uVar2 != 0x600) {
LAB_001150d4:
        _e.plugin = 0xb00;
        _e.code = 0x8000000a;
        fprintf(_stderr,"%s:%d: ",
                "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/gl/gl3raster.cpp"
                ,0x2b6);
        __stream = _stderr;
        pcVar4 = dbgsprint(0x8000000a);
        fprintf(__stream,"%s\n",pcVar4);
        setError(&_e);
        return 0;
      }
      pcVar11 = conv_RGB888_from_RGB888;
    }
  }
  bVar3 = Image::hasAlpha(image);
  *(bool *)((long)&raster->width + lVar8 + 1) = bVar3 != 0;
  puVar1 = raster->pixels;
  puVar10 = puVar1;
  if (puVar1 == (uint8 *)0x0) {
    Raster::lock(raster,0,5);
    puVar10 = raster->pixels;
  }
  iVar7 = image->height;
  for (iVar5 = 0; iVar5 < iVar7; iVar5 = iVar5 + 1) {
    puVar9 = puVar10;
    for (iVar7 = 0; iVar7 < image->width; iVar7 = iVar7 + 1) {
      (*pcVar11)(puVar9);
      puVar9 = puVar9 + *(int *)((long)&raster->privateFlags + lVar8);
    }
    puVar10 = puVar10 + raster->stride;
    iVar7 = image->height;
  }
  if (puVar1 == (uint8 *)0x0) {
    Raster::unlock(raster,0);
  }
  if (local_58 != (Image *)0x0) {
    Image::destroy(local_58);
  }
  return 1;
}

Assistant:

bool32
rasterFromImage(Raster *raster, Image *image)
{
	if((raster->type&0xF) != Raster::TEXTURE)
		return 0;

	void (*conv)(uint8 *out, uint8 *in) = nil;

	// Unpalettize image if necessary but don't change original
	Image *truecolimg = nil;
	if(image->depth <= 8){
		truecolimg = Image::create(image->width, image->height, image->depth);
		truecolimg->pixels = image->pixels;
		truecolimg->stride = image->stride;
		truecolimg->palette = image->palette;
		truecolimg->unpalettize();
		image = truecolimg;
	}

	Gl3Raster *natras = GETGL3RASTEREXT(raster);
	int32 format = raster->format&0xF00;
	assert(!natras->isCompressed);
	switch(image->depth){
	case 32:
		if(gl3Caps.gles)
			conv = conv_RGBA8888_from_RGBA8888;
		else if(format == Raster::C8888)
			conv = conv_RGBA8888_from_RGBA8888;
		else if(format == Raster::C888)
			conv = conv_RGB888_from_RGB888;
		else
			goto err;
		break;
	case 24:
		if(gl3Caps.gles)
			conv = conv_RGBA8888_from_RGB888;
		else if(format == Raster::C8888)
			conv = conv_RGBA8888_from_RGB888;
		else if(format == Raster::C888)
			conv = conv_RGB888_from_RGB888;
		else
			goto err;
		break;
	case 16:
		if(gl3Caps.gles)
			conv = conv_RGBA8888_from_ARGB1555;
		else if(format == Raster::C1555)
			conv = conv_RGBA5551_from_ARGB1555;
		else
			goto err;
		break;

	case 8:
	case 4:
	default:
	err:
		RWERROR((ERR_INVRASTER));
		return 0;
	}

	natras->hasAlpha = image->hasAlpha();

	bool unlock = false;
	if(raster->pixels == nil){
		raster->lock(0, Raster::LOCKWRITE|Raster::LOCKNOFETCH);
		unlock = true;
	}

	uint8 *pixels = raster->pixels;
	assert(pixels);
	uint8 *imgpixels = image->pixels + (image->height-1)*image->stride;

	int x, y;
	assert(image->width == raster->width);
	assert(image->height == raster->height);
	for(y = 0; y < image->height; y++){
		uint8 *imgrow = imgpixels;
		uint8 *rasrow = pixels;
		for(x = 0; x < image->width; x++){
			conv(rasrow, imgrow);
			imgrow += image->bpp;
			rasrow += natras->bpp;
		}
		imgpixels -= image->stride;
		pixels += raster->stride;
	}
	if(unlock)
		raster->unlock(0);

	if(truecolimg)
		truecolimg->destroy();

	return 1;
}